

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmlst.cpp
# Opt level: O0

int CVmObjList::getp_len(vm_val_t *retval,vm_val_t *self_val,char *lst,uint *argc)

{
  int iVar1;
  size_t sVar2;
  vm_val_t *in_RDI;
  CVmNativeCodeDesc *in_stack_ffffffffffffffb8;
  uint *in_stack_ffffffffffffffc0;
  vm_val_t *in_stack_ffffffffffffffc8;
  
  if ((getp_len(vm_val_t*,vm_val_t_const*,char_const*,unsigned_int*)::desc == '\0') &&
     (iVar1 = __cxa_guard_acquire(&getp_len(vm_val_t*,vm_val_t_const*,char_const*,unsigned_int*)::
                                   desc), iVar1 != 0)) {
    CVmNativeCodeDesc::CVmNativeCodeDesc(&getp_len::desc,0);
    __cxa_guard_release(&getp_len(vm_val_t*,vm_val_t_const*,char_const*,unsigned_int*)::desc);
  }
  iVar1 = CVmObject::get_prop_check_argc
                    (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  if (iVar1 == 0) {
    sVar2 = vmb_get_len((char *)0x318563);
    vm_val_t::set_int(in_RDI,(int32_t)sVar2);
  }
  return 1;
}

Assistant:

int CVmObjList::getp_len(VMG_ vm_val_t *retval, const vm_val_t *self_val,
                         const char *lst, uint *argc)
{
    static CVmNativeCodeDesc desc(0);

    /* check arguments */
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* return the element count */
    retval->set_int(vmb_get_len(lst));

    /* handled */
    return TRUE;
}